

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_suite.cpp
# Opt level: O0

void value_count_suite::count_map(void)

{
  size_type in_RCX;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_a28;
  undefined4 local_a1c;
  basic_variable<std::allocator<char>_> local_a18;
  size_type local_9e8;
  undefined4 local_9dc;
  size_type local_9d8;
  undefined4 local_9cc;
  basic_variable<std::allocator<char>_> local_9c8;
  size_type local_998;
  undefined4 local_98c;
  basic_variable<std::allocator<char>_> local_988;
  size_type local_958;
  undefined4 local_94c;
  size_type local_948;
  undefined4 local_93c;
  basic_variable<std::allocator<char>_> local_938;
  size_type local_908;
  undefined4 local_8fc;
  size_type local_8f8;
  undefined4 local_8ec;
  basic_variable<std::allocator<char>_> local_8e8;
  size_type local_8b0;
  undefined4 local_8a4;
  double local_8a0;
  size_type local_898;
  undefined4 local_88c;
  basic_variable<std::allocator<char>_> local_888;
  size_type local_850;
  undefined4 local_844;
  double local_840;
  size_type local_838;
  undefined4 local_82c;
  basic_variable<std::allocator<char>_> local_828;
  size_type local_7f0 [2];
  undefined4 local_7e0;
  int local_7dc;
  size_type local_7d8;
  undefined4 local_7cc;
  basic_variable<std::allocator<char>_> local_7c8;
  size_type local_790 [2];
  undefined4 local_780;
  int local_77c;
  size_type local_778;
  undefined4 local_76c;
  basic_variable<std::allocator<char>_> local_768;
  size_type local_730 [2];
  undefined4 local_720;
  bool local_719;
  size_type local_718;
  undefined4 local_70c;
  basic_variable<std::allocator<char>_> local_708;
  size_type local_6d0 [2];
  undefined4 local_6c0;
  bool local_6b9;
  size_type local_6b8;
  undefined4 local_6ac;
  basic_variable<std::allocator<char>_> local_6a8;
  size_type local_670 [2];
  undefined4 local_660;
  nullable local_65c;
  size_type local_658 [2];
  nullable local_648;
  bool local_641;
  nullable local_640 [2];
  bool local_635;
  nullable local_634;
  double local_630;
  int local_624;
  bool local_61d;
  nullable local_61c;
  double local_618;
  int local_60c;
  bool local_605 [17];
  nullable local_5f4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_5f0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_5e8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_588;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_528;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_4c8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_468;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_408;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_3a8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_348;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_2e8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_288;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_228;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1c8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_168;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_108;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a8;
  undefined1 local_48 [24];
  variable data;
  
  local_5f0 = &local_5e8;
  local_5f4 = null;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_trial::dynamic::nullable,_true>
            (local_5f0,(char (*) [6])"alpha",&local_5f4);
  local_5f0 = &local_588;
  local_605[0] = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>(local_5f0,(char (*) [6])"bravo",local_605);
  local_5f0 = &local_528;
  local_60c = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_int,_true>(local_5f0,(char (*) [8])"charlie",&local_60c);
  local_5f0 = &local_4c8;
  local_618 = 3.0;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_double,_true>(local_5f0,(char (*) [6])"delta",&local_618);
  local_5f0 = &local_468;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[9],_true>
            (local_5f0,(char (*) [5])"echo",(char (*) [9])"hydrogen");
  local_5f0 = &local_408;
  local_61c = null;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_trial::dynamic::nullable,_true>
            (local_5f0,(char (*) [8])"foxtrot",&local_61c);
  local_5f0 = &local_3a8;
  local_61d = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_bool,_true>(local_5f0,(char (*) [5])"golf",&local_61d);
  local_5f0 = &local_348;
  local_624 = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_5f0,(char (*) [6])"hotel",&local_624);
  local_5f0 = &local_2e8;
  local_630 = 3.0;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_double,_true>(local_5f0,(char (*) [6])"india",&local_630);
  local_5f0 = &local_288;
  local_634 = null;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_trial::dynamic::nullable,_true>
            (local_5f0,(char (*) [7])"juliet",&local_634);
  local_5f0 = &local_228;
  local_635 = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_bool,_true>(local_5f0,(char (*) [5])"kilo",&local_635);
  local_5f0 = &local_1c8;
  local_640[1] = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_int,_true>(local_5f0,(char (*) [5])"lima",(int *)(local_640 + 1));
  local_5f0 = &local_168;
  local_640[0] = null;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_trial::dynamic::nullable,_true>
            (local_5f0,(char (*) [5])"mike",local_640);
  local_5f0 = &local_108;
  local_641 = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_bool,_true>(local_5f0,(char (*) [9])"november",&local_641);
  local_5f0 = &local_a8;
  local_648 = null;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_trial::dynamic::nullable,_true>
            (local_5f0,(char (*) [6])"oscar",&local_648);
  local_48._0_8_ = &local_5e8;
  local_48._8_8_ = 0xf;
  init._M_len = in_RCX;
  init._M_array = (iterator)0xf;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_map<std::allocator<char>_> *)local_48._0_8_,init);
  local_a28 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_48;
  do {
    local_a28 = local_a28 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_a28);
  } while (local_a28 != &local_5e8);
  local_65c = null;
  local_658[0] = trial::dynamic::value::count<std::allocator<char>,trial::dynamic::nullable>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_65c);
  local_660 = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, null)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x14e,"void value_count_suite::count_map()",local_658,&local_660);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6a8);
  local_670[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_6a8);
  local_6ac = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable())","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x14f,"void value_count_suite::count_map()",local_670,&local_6ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6a8);
  local_6b9 = true;
  local_6b8 = trial::dynamic::value::count<std::allocator<char>,bool>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_6b9);
  local_6c0 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, true)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x150,"void value_count_suite::count_map()",&local_6b8,&local_6c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_708,true);
  local_6d0[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_708);
  local_70c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(true))","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x151,"void value_count_suite::count_map()",local_6d0,&local_70c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_708);
  local_719 = false;
  local_718 = trial::dynamic::value::count<std::allocator<char>,bool>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_719);
  local_720 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, false)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x152,"void value_count_suite::count_map()",&local_718,&local_720);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_768,false);
  local_730[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_768);
  local_76c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(false))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x153,"void value_count_suite::count_map()",local_730,&local_76c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_768);
  local_77c = 2;
  local_778 = trial::dynamic::value::count<std::allocator<char>,int>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_77c);
  local_780 = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 2)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x154,"void value_count_suite::count_map()",&local_778,&local_780);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_7c8,2);
  local_790[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_7c8);
  local_7cc = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(2))","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x155,"void value_count_suite::count_map()",local_790,&local_7cc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7c8);
  local_7dc = 0x16;
  local_7d8 = trial::dynamic::value::count<std::allocator<char>,int>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_7dc);
  local_7e0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 22)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x156,"void value_count_suite::count_map()",&local_7d8,&local_7e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_828,0x16);
  local_7f0[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_828);
  local_82c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(22))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x157,"void value_count_suite::count_map()",local_7f0,&local_82c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_828);
  local_840 = 3.0;
  local_838 = trial::dynamic::value::count<std::allocator<char>,double>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_840);
  local_844 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 3.0)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x158,"void value_count_suite::count_map()",&local_838,&local_844);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_888,3.0);
  local_850 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_888);
  local_88c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(3.0))","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x159,"void value_count_suite::count_map()",&local_850,&local_88c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_888);
  local_8a0 = 33.0;
  local_898 = trial::dynamic::value::count<std::allocator<char>,double>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_8a0);
  local_8a4 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 33.0)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x15a,"void value_count_suite::count_map()",&local_898,&local_8a4);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_8e8,33.0);
  local_8b0 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_8e8);
  local_8ec = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(33.0))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x15b,"void value_count_suite::count_map()",&local_8b0,&local_8ec);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8e8);
  local_8f8 = trial::dynamic::value::count<std::allocator<char>,char[9]>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (char (*) [9])"hydrogen");
  local_8fc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, \"hydrogen\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x15c,"void value_count_suite::count_map()",&local_8f8,&local_8fc);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_938,"hydrogen");
  local_908 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_938);
  local_93c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(\"hydrogen\"))","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x15d,"void value_count_suite::count_map()",&local_908,&local_93c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_938);
  local_948 = trial::dynamic::value::count<std::allocator<char>,char[6]>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (char (*) [6])"alpha");
  local_94c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, \"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x15e,"void value_count_suite::count_map()",&local_948,&local_94c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_988,"alpha");
  local_958 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_988);
  local_98c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x15f,"void value_count_suite::count_map()",&local_958,&local_98c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_988);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_998 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_9c8);
  local_9cc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, array::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x160,"void value_count_suite::count_map()",&local_998,&local_9cc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9c8);
  local_9d8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_9dc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, data)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x161,"void value_count_suite::count_map()",&local_9d8,&local_9dc);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_9e8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_a18);
  local_a1c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, map::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x162,"void value_count_suite::count_map()",&local_9e8,&local_a1c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a18);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void count_map()
{
    variable data = map::make(
        {
            {"alpha", null},
            {"bravo", true},
            {"charlie", 2},
            {"delta", 3.0},
            {"echo", "hydrogen"},
            {"foxtrot", null},
            {"golf", true},
            {"hotel", 2},
            {"india", 3.0},
            {"juliet", null},
            {"kilo", true},
            {"lima", 2},
            {"mike", null},
            {"november", true},
            {"oscar", null}
        });

    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, null), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable()), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, true), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(true)), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, false), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(false)), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 2), 3);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(2)), 3);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 22), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(22)), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 3.0), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(3.0)), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 33.0), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(33.0)), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, "hydrogen"), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable("hydrogen")), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, "alpha"), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable("alpha")), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, array::make()), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, data), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, map::make()), 0);
}